

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O0

void __thiscall
websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::
log_err<std::error_code>
          (endpoint<websocketpp::config::asio::transport_config> *this,level l,char *msg,
          error_code *ec)

{
  ostream *poVar1;
  error_code *this_00;
  element_type *this_01;
  size_t in_RCX;
  char *in_RDX;
  int in_ESI;
  stringstream s;
  error_code *in_stack_fffffffffffffdd8;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffde0;
  string local_1f8 [32];
  string local_1d8 [48];
  stringstream local_1a8 [16];
  ostream local_198 [384];
  char *local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,local_18);
  std::operator<<(poVar1," error: ");
  this_00 = (error_code *)std::operator<<(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  poVar1 = std::operator<<((ostream *)this_00," (");
  std::error_code::message_abi_cxx11_(this_00);
  poVar1 = std::operator<<(poVar1,local_1d8);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string(local_1d8);
  this_01 = std::
            __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2e552d);
  std::__cxx11::stringstream::str();
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
            (this_01,local_c,local_1f8,in_RCX);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void log_err(log::level l, char const * msg, error_type const & ec) {
        std::stringstream s;
        s << msg << " error: " << ec << " (" << ec.message() << ")";
        m_elog->write(l,s.str());
    }